

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall ON_Viewport::GetFarPlane(ON_Viewport *this,ON_Plane *far_plane)

{
  double dVar1;
  byte bVar2;
  ON_3dVector local_60;
  ON_3dPoint local_48;
  
  bVar2 = this->m_bValidCamera & this->m_bValidFrustum;
  if (bVar2 == 1) {
    ::operator*(&local_60,this->m_frus_far,&this->m_CamZ);
    ON_3dPoint::operator-(&local_48,&this->m_CamLoc,&local_60);
    (far_plane->origin).z = local_48.z;
    (far_plane->origin).x = local_48.x;
    (far_plane->origin).y = local_48.y;
    (far_plane->xaxis).z = (this->m_CamX).z;
    dVar1 = (this->m_CamX).y;
    (far_plane->xaxis).x = (this->m_CamX).x;
    (far_plane->xaxis).y = dVar1;
    dVar1 = (this->m_CamY).y;
    (far_plane->yaxis).x = (this->m_CamY).x;
    (far_plane->yaxis).y = dVar1;
    (far_plane->yaxis).z = (this->m_CamY).z;
    dVar1 = (this->m_CamZ).y;
    (far_plane->zaxis).x = (this->m_CamZ).x;
    (far_plane->zaxis).y = dVar1;
    (far_plane->zaxis).z = (this->m_CamZ).z;
    ON_Plane::UpdateEquation(far_plane);
  }
  return (bool)bVar2;
}

Assistant:

bool ON_Viewport::GetFarPlane( ON_Plane& far_plane ) const
{
  bool rc = IsValidFrustum() && IsValidCamera();
  if ( rc ) 
  {
    far_plane.origin = m_CamLoc - m_frus_far*m_CamZ;
    far_plane.xaxis = m_CamX;
    far_plane.yaxis = m_CamY;
    far_plane.zaxis = m_CamZ;
    far_plane.UpdateEquation();
  }
  return rc;
}